

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Channel.cpp
# Opt level: O2

void __thiscall
higan::Channel::Channel(Channel *this,EventLoop *loop,string *connection_name,int fd)

{
  this->loop_ = loop;
  std::__cxx11::string::string((string *)&this->connection_name_,(string *)connection_name);
  this->fd_ = fd;
  this->connecting_ = true;
  this->register_readable_ = false;
  this->register_writable_ = false;
  this->channel_readable_ = false;
  this->channel_writable_ = false;
  this->channel_error_ = false;
  *(undefined8 *)&(this->error_callback_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->error_callback_).super__Function_base._M_functor + 8) = 0;
  (this->error_callback_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->error_callback_)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->writable_callback_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->writable_callback_).super__Function_base._M_functor + 8) = 0;
  (this->writable_callback_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->writable_callback_)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->readable_callback_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->readable_callback_).super__Function_base._M_functor + 8) = 0;
  (this->readable_callback_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->readable_callback_)._M_invoker = (_Invoker_type)0x0;
  this->channel_status_ = CHANNEL_NOT_ADDED;
  return;
}

Assistant:

Channel::Channel(EventLoop* loop, const std::string& connection_name,int fd):
		loop_(loop),
		connection_name_(connection_name),
		fd_(fd),
		connecting_(true),
		register_readable_(false),
		register_writable_(false),
		channel_readable_(false),
		channel_writable_(false),
		channel_error_(false),
		channel_status_(CHANNEL_NOT_ADDED)
{

}